

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefIsNull(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  RefIsNull *pRVar1;
  bool bVar2;
  Ok local_95;
  uint local_94;
  Err local_90;
  Err *local_60;
  Err *err;
  Result<wasm::Ok> _val;
  RefIsNull curr;
  IRBuilder *this_local;
  
  pRVar1 = (RefIsNull *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  RefIsNull::RefIsNull(pRVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitRefIsNull
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
  local_60 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_60 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_90,local_60);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_90);
    wasm::Err::~Err(&local_90);
  }
  local_94 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_94 == 0) {
    pRVar1 = Builder::makeRefIsNull
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)42>.super_Expression.
                        type.id);
    push(this,(Expression *)pRVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_95);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefIsNull() {
  RefIsNull curr;
  CHECK_ERR(visitRefIsNull(&curr));
  push(builder.makeRefIsNull(curr.value));
  return Ok{};
}